

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O3

void __thiscall SAUF<UFPC>::FirstScan(SAUF<UFPC> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long local_40;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar7 = (long)*(int *)&pMVar2->field_0x8;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  if (0 < lVar7) {
    local_40 = -1;
    lVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar6 = *(long *)&pMVar2->field_0x10;
        lVar11 = **(long **)&pMVar2->field_0x48;
        lVar10 = lVar11 * lVar8 + lVar6;
        lVar9 = *(long *)&pMVar3->field_0x10;
        lVar12 = **(long **)&pMVar3->field_0x48;
        lVar13 = lVar12 * lVar8 + lVar9;
        lVar9 = lVar9 + lVar12 * local_40;
        lVar6 = lVar6 + lVar11 * local_40;
        lVar12 = 0;
        lVar11 = -1;
        do {
          if (*(char *)(lVar10 + 1 + lVar11) != '\0') {
            if (lVar8 == 0) {
              lVar5 = lVar11;
              if (lVar11 != -1) {
LAB_001cc615:
                if (*(char *)(lVar10 + lVar5) != '\0') {
                  uVar4 = *(uint *)(lVar13 + lVar5 * 4);
                  goto LAB_001cc66c;
                }
              }
LAB_001cc65d:
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar4 = UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
            }
            else if (*(char *)(lVar6 + 1 + lVar11) == '\0') {
              if ((lVar11 + 1 < (long)(int)uVar1 + -1) && (*(char *)(lVar6 + 2 + lVar11) != '\0')) {
                if (lVar11 == -1) {
LAB_001cc6dd:
                  uVar4 = *(uint *)(lVar9 + 8 + lVar11 * 4);
                }
                else {
                  if (*(char *)(lVar6 + lVar11) == '\0') {
                    if (*(char *)(lVar10 + lVar11) == '\0') goto LAB_001cc6dd;
                    uVar4 = *(uint *)(lVar13 + lVar11 * 4);
                  }
                  else {
                    uVar4 = *(uint *)(lVar9 + lVar11 * 4);
                  }
                  uVar4 = UFPC::Merge(uVar4,*(uint *)(lVar9 + 8 + lVar11 * 4));
                }
              }
              else {
                if (lVar11 == -1) goto LAB_001cc65d;
                if (*(char *)(lVar6 + lVar11) == '\0') {
                  lVar5 = lVar12 + -1;
                  goto LAB_001cc615;
                }
                uVar4 = *(uint *)(lVar9 + lVar11 * 4);
              }
            }
            else {
              uVar4 = *(uint *)(lVar9 + 4 + lVar11 * 4);
            }
LAB_001cc66c:
            *(uint *)(lVar13 + 4 + lVar11 * 4) = uVar4;
          }
          lVar12 = lVar12 + 1;
          lVar5 = lVar11 - (ulong)uVar1;
          lVar11 = lVar11 + 1;
        } while (lVar5 != -2);
      }
      lVar8 = lVar8 + 1;
      local_40 = local_40 + 1;
    } while (lVar8 != lVar7);
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }